

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_VERSION_ES_CM_1_0(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_VERSION_ES_CM_1_0 != 0) {
    glad_glAlphaFunc = (PFNGLALPHAFUNCPROC)(*load)("glAlphaFunc");
    glad_glClearColor = (PFNGLCLEARCOLORPROC)(*load)("glClearColor");
    glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)(*load)("glClearDepthf");
    glad_glClipPlanef = (PFNGLCLIPPLANEFPROC)(*load)("glClipPlanef");
    glad_glColor4f = (PFNGLCOLOR4FPROC)(*load)("glColor4f");
    glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)(*load)("glDepthRangef");
    glad_glFogf = (PFNGLFOGFPROC)(*load)("glFogf");
    glad_glFogfv = (PFNGLFOGFVPROC)(*load)("glFogfv");
    glad_glFrustumf = (PFNGLFRUSTUMFPROC)(*load)("glFrustumf");
    glad_glGetClipPlanef = (PFNGLGETCLIPPLANEFPROC)(*load)("glGetClipPlanef");
    glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*load)("glGetFloatv");
    glad_glGetLightfv = (PFNGLGETLIGHTFVPROC)(*load)("glGetLightfv");
    glad_glGetMaterialfv = (PFNGLGETMATERIALFVPROC)(*load)("glGetMaterialfv");
    glad_glGetTexEnvfv = (PFNGLGETTEXENVFVPROC)(*load)("glGetTexEnvfv");
    glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*load)("glGetTexParameterfv");
    glad_glLightModelf = (PFNGLLIGHTMODELFPROC)(*load)("glLightModelf");
    glad_glLightModelfv = (PFNGLLIGHTMODELFVPROC)(*load)("glLightModelfv");
    glad_glLightf = (PFNGLLIGHTFPROC)(*load)("glLightf");
    glad_glLightfv = (PFNGLLIGHTFVPROC)(*load)("glLightfv");
    glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*load)("glLineWidth");
    glad_glLoadMatrixf = (PFNGLLOADMATRIXFPROC)(*load)("glLoadMatrixf");
    glad_glMaterialf = (PFNGLMATERIALFPROC)(*load)("glMaterialf");
    glad_glMaterialfv = (PFNGLMATERIALFVPROC)(*load)("glMaterialfv");
    glad_glMultMatrixf = (PFNGLMULTMATRIXFPROC)(*load)("glMultMatrixf");
    glad_glMultiTexCoord4f = (PFNGLMULTITEXCOORD4FPROC)(*load)("glMultiTexCoord4f");
    glad_glNormal3f = (PFNGLNORMAL3FPROC)(*load)("glNormal3f");
    glad_glOrthof = (PFNGLORTHOFPROC)(*load)("glOrthof");
    glad_glPointParameterf = (PFNGLPOINTPARAMETERFPROC)(*load)("glPointParameterf");
    glad_glPointParameterfv = (PFNGLPOINTPARAMETERFVPROC)(*load)("glPointParameterfv");
    glad_glPointSize = (PFNGLPOINTSIZEPROC)(*load)("glPointSize");
    glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*load)("glPolygonOffset");
    glad_glRotatef = (PFNGLROTATEFPROC)(*load)("glRotatef");
    glad_glScalef = (PFNGLSCALEFPROC)(*load)("glScalef");
    glad_glTexEnvf = (PFNGLTEXENVFPROC)(*load)("glTexEnvf");
    glad_glTexEnvfv = (PFNGLTEXENVFVPROC)(*load)("glTexEnvfv");
    glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*load)("glTexParameterf");
    glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*load)("glTexParameterfv");
    glad_glTranslatef = (PFNGLTRANSLATEFPROC)(*load)("glTranslatef");
    glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*load)("glActiveTexture");
    glad_glAlphaFuncx = (PFNGLALPHAFUNCXPROC)(*load)("glAlphaFuncx");
    glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)("glBindBuffer");
    glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*load)("glBindTexture");
    glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*load)("glBlendFunc");
    glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)("glBufferData");
    glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)("glBufferSubData");
    glad_glClear = (PFNGLCLEARPROC)(*load)("glClear");
    glad_glClearColorx = (PFNGLCLEARCOLORXPROC)(*load)("glClearColorx");
    glad_glClearDepthx = (PFNGLCLEARDEPTHXPROC)(*load)("glClearDepthx");
    glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*load)("glClearStencil");
    glad_glClientActiveTexture = (PFNGLCLIENTACTIVETEXTUREPROC)(*load)("glClientActiveTexture");
    glad_glClipPlanex = (PFNGLCLIPPLANEXPROC)(*load)("glClipPlanex");
    glad_glColor4ub = (PFNGLCOLOR4UBPROC)(*load)("glColor4ub");
    glad_glColor4x = (PFNGLCOLOR4XPROC)(*load)("glColor4x");
    glad_glColorMask = (PFNGLCOLORMASKPROC)(*load)("glColorMask");
    glad_glColorPointer = (PFNGLCOLORPOINTERPROC)(*load)("glColorPointer");
    glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*load)("glCompressedTexImage2D");
    glad_glCompressedTexSubImage2D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*load)("glCompressedTexSubImage2D");
    glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*load)("glCopyTexImage2D");
    glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*load)("glCopyTexSubImage2D");
    glad_glCullFace = (PFNGLCULLFACEPROC)(*load)("glCullFace");
    glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)("glDeleteBuffers");
    glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*load)("glDeleteTextures");
    glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*load)("glDepthFunc");
    glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*load)("glDepthMask");
    glad_glDepthRangex = (PFNGLDEPTHRANGEXPROC)(*load)("glDepthRangex");
    glad_glDisable = (PFNGLDISABLEPROC)(*load)("glDisable");
    glad_glDisableClientState = (PFNGLDISABLECLIENTSTATEPROC)(*load)("glDisableClientState");
    glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*load)("glDrawArrays");
    glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*load)("glDrawElements");
    glad_glEnable = (PFNGLENABLEPROC)(*load)("glEnable");
    glad_glEnableClientState = (PFNGLENABLECLIENTSTATEPROC)(*load)("glEnableClientState");
    glad_glFinish = (PFNGLFINISHPROC)(*load)("glFinish");
    glad_glFlush = (PFNGLFLUSHPROC)(*load)("glFlush");
    glad_glFogx = (PFNGLFOGXPROC)(*load)("glFogx");
    glad_glFogxv = (PFNGLFOGXVPROC)(*load)("glFogxv");
    glad_glFrontFace = (PFNGLFRONTFACEPROC)(*load)("glFrontFace");
    glad_glFrustumx = (PFNGLFRUSTUMXPROC)(*load)("glFrustumx");
    glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*load)("glGetBooleanv");
    glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)(*load)("glGetBufferParameteriv");
    glad_glGetClipPlanex = (PFNGLGETCLIPPLANEXPROC)(*load)("glGetClipPlanex");
    glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)("glGenBuffers");
    glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*load)("glGenTextures");
    glad_glGetError = (PFNGLGETERRORPROC)(*load)("glGetError");
    glad_glGetFixedv = (PFNGLGETFIXEDVPROC)(*load)("glGetFixedv");
    glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*load)("glGetIntegerv");
    glad_glGetLightxv = (PFNGLGETLIGHTXVPROC)(*load)("glGetLightxv");
    glad_glGetMaterialxv = (PFNGLGETMATERIALXVPROC)(*load)("glGetMaterialxv");
    glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*load)("glGetPointerv");
    glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
    glad_glGetTexEnviv = (PFNGLGETTEXENVIVPROC)(*load)("glGetTexEnviv");
    glad_glGetTexEnvxv = (PFNGLGETTEXENVXVPROC)(*load)("glGetTexEnvxv");
    glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*load)("glGetTexParameteriv");
    glad_glGetTexParameterxv = (PFNGLGETTEXPARAMETERXVPROC)(*load)("glGetTexParameterxv");
    glad_glHint = (PFNGLHINTPROC)(*load)("glHint");
    glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)("glIsBuffer");
    glad_glIsEnabled = (PFNGLISENABLEDPROC)(*load)("glIsEnabled");
    glad_glIsTexture = (PFNGLISTEXTUREPROC)(*load)("glIsTexture");
    glad_glLightModelx = (PFNGLLIGHTMODELXPROC)(*load)("glLightModelx");
    glad_glLightModelxv = (PFNGLLIGHTMODELXVPROC)(*load)("glLightModelxv");
    glad_glLightx = (PFNGLLIGHTXPROC)(*load)("glLightx");
    glad_glLightxv = (PFNGLLIGHTXVPROC)(*load)("glLightxv");
    glad_glLineWidthx = (PFNGLLINEWIDTHXPROC)(*load)("glLineWidthx");
    glad_glLoadIdentity = (PFNGLLOADIDENTITYPROC)(*load)("glLoadIdentity");
    glad_glLoadMatrixx = (PFNGLLOADMATRIXXPROC)(*load)("glLoadMatrixx");
    glad_glLogicOp = (PFNGLLOGICOPPROC)(*load)("glLogicOp");
    glad_glMaterialx = (PFNGLMATERIALXPROC)(*load)("glMaterialx");
    glad_glMaterialxv = (PFNGLMATERIALXVPROC)(*load)("glMaterialxv");
    glad_glMatrixMode = (PFNGLMATRIXMODEPROC)(*load)("glMatrixMode");
    glad_glMultMatrixx = (PFNGLMULTMATRIXXPROC)(*load)("glMultMatrixx");
    glad_glMultiTexCoord4x = (PFNGLMULTITEXCOORD4XPROC)(*load)("glMultiTexCoord4x");
    glad_glNormal3x = (PFNGLNORMAL3XPROC)(*load)("glNormal3x");
    glad_glNormalPointer = (PFNGLNORMALPOINTERPROC)(*load)("glNormalPointer");
    glad_glOrthox = (PFNGLORTHOXPROC)(*load)("glOrthox");
    glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*load)("glPixelStorei");
    glad_glPointParameterx = (PFNGLPOINTPARAMETERXPROC)(*load)("glPointParameterx");
    glad_glPointParameterxv = (PFNGLPOINTPARAMETERXVPROC)(*load)("glPointParameterxv");
    glad_glPointSizex = (PFNGLPOINTSIZEXPROC)(*load)("glPointSizex");
    glad_glPolygonOffsetx = (PFNGLPOLYGONOFFSETXPROC)(*load)("glPolygonOffsetx");
    glad_glPopMatrix = (PFNGLPOPMATRIXPROC)(*load)("glPopMatrix");
    glad_glPushMatrix = (PFNGLPUSHMATRIXPROC)(*load)("glPushMatrix");
    glad_glReadPixels = (PFNGLREADPIXELSPROC)(*load)("glReadPixels");
    glad_glRotatex = (PFNGLROTATEXPROC)(*load)("glRotatex");
    glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*load)("glSampleCoverage");
    glad_glSampleCoveragex = (PFNGLSAMPLECOVERAGEXPROC)(*load)("glSampleCoveragex");
    glad_glScalex = (PFNGLSCALEXPROC)(*load)("glScalex");
    glad_glScissor = (PFNGLSCISSORPROC)(*load)("glScissor");
    glad_glShadeModel = (PFNGLSHADEMODELPROC)(*load)("glShadeModel");
    glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*load)("glStencilFunc");
    glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*load)("glStencilMask");
    glad_glStencilOp = (PFNGLSTENCILOPPROC)(*load)("glStencilOp");
    glad_glTexCoordPointer = (PFNGLTEXCOORDPOINTERPROC)(*load)("glTexCoordPointer");
    glad_glTexEnvi = (PFNGLTEXENVIPROC)(*load)("glTexEnvi");
    glad_glTexEnvx = (PFNGLTEXENVXPROC)(*load)("glTexEnvx");
    glad_glTexEnviv = (PFNGLTEXENVIVPROC)(*load)("glTexEnviv");
    glad_glTexEnvxv = (PFNGLTEXENVXVPROC)(*load)("glTexEnvxv");
    glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*load)("glTexImage2D");
    glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*load)("glTexParameteri");
    glad_glTexParameterx = (PFNGLTEXPARAMETERXPROC)(*load)("glTexParameterx");
    glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*load)("glTexParameteriv");
    glad_glTexParameterxv = (PFNGLTEXPARAMETERXVPROC)(*load)("glTexParameterxv");
    glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*load)("glTexSubImage2D");
    glad_glTranslatex = (PFNGLTRANSLATEXPROC)(*load)("glTranslatex");
    glad_glVertexPointer = (PFNGLVERTEXPOINTERPROC)(*load)("glVertexPointer");
    glad_glViewport = (PFNGLVIEWPORTPROC)(*load)("glViewport");
  }
  return;
}

Assistant:

static void load_GL_VERSION_ES_CM_1_0(GLADloadproc load) {
	if(!GLAD_GL_VERSION_ES_CM_1_0) return;
	glad_glAlphaFunc = (PFNGLALPHAFUNCPROC)load("glAlphaFunc");
	glad_glClearColor = (PFNGLCLEARCOLORPROC)load("glClearColor");
	glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)load("glClearDepthf");
	glad_glClipPlanef = (PFNGLCLIPPLANEFPROC)load("glClipPlanef");
	glad_glColor4f = (PFNGLCOLOR4FPROC)load("glColor4f");
	glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)load("glDepthRangef");
	glad_glFogf = (PFNGLFOGFPROC)load("glFogf");
	glad_glFogfv = (PFNGLFOGFVPROC)load("glFogfv");
	glad_glFrustumf = (PFNGLFRUSTUMFPROC)load("glFrustumf");
	glad_glGetClipPlanef = (PFNGLGETCLIPPLANEFPROC)load("glGetClipPlanef");
	glad_glGetFloatv = (PFNGLGETFLOATVPROC)load("glGetFloatv");
	glad_glGetLightfv = (PFNGLGETLIGHTFVPROC)load("glGetLightfv");
	glad_glGetMaterialfv = (PFNGLGETMATERIALFVPROC)load("glGetMaterialfv");
	glad_glGetTexEnvfv = (PFNGLGETTEXENVFVPROC)load("glGetTexEnvfv");
	glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)load("glGetTexParameterfv");
	glad_glLightModelf = (PFNGLLIGHTMODELFPROC)load("glLightModelf");
	glad_glLightModelfv = (PFNGLLIGHTMODELFVPROC)load("glLightModelfv");
	glad_glLightf = (PFNGLLIGHTFPROC)load("glLightf");
	glad_glLightfv = (PFNGLLIGHTFVPROC)load("glLightfv");
	glad_glLineWidth = (PFNGLLINEWIDTHPROC)load("glLineWidth");
	glad_glLoadMatrixf = (PFNGLLOADMATRIXFPROC)load("glLoadMatrixf");
	glad_glMaterialf = (PFNGLMATERIALFPROC)load("glMaterialf");
	glad_glMaterialfv = (PFNGLMATERIALFVPROC)load("glMaterialfv");
	glad_glMultMatrixf = (PFNGLMULTMATRIXFPROC)load("glMultMatrixf");
	glad_glMultiTexCoord4f = (PFNGLMULTITEXCOORD4FPROC)load("glMultiTexCoord4f");
	glad_glNormal3f = (PFNGLNORMAL3FPROC)load("glNormal3f");
	glad_glOrthof = (PFNGLORTHOFPROC)load("glOrthof");
	glad_glPointParameterf = (PFNGLPOINTPARAMETERFPROC)load("glPointParameterf");
	glad_glPointParameterfv = (PFNGLPOINTPARAMETERFVPROC)load("glPointParameterfv");
	glad_glPointSize = (PFNGLPOINTSIZEPROC)load("glPointSize");
	glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)load("glPolygonOffset");
	glad_glRotatef = (PFNGLROTATEFPROC)load("glRotatef");
	glad_glScalef = (PFNGLSCALEFPROC)load("glScalef");
	glad_glTexEnvf = (PFNGLTEXENVFPROC)load("glTexEnvf");
	glad_glTexEnvfv = (PFNGLTEXENVFVPROC)load("glTexEnvfv");
	glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)load("glTexParameterf");
	glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)load("glTexParameterfv");
	glad_glTranslatef = (PFNGLTRANSLATEFPROC)load("glTranslatef");
	glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)load("glActiveTexture");
	glad_glAlphaFuncx = (PFNGLALPHAFUNCXPROC)load("glAlphaFuncx");
	glad_glBindBuffer = (PFNGLBINDBUFFERPROC)load("glBindBuffer");
	glad_glBindTexture = (PFNGLBINDTEXTUREPROC)load("glBindTexture");
	glad_glBlendFunc = (PFNGLBLENDFUNCPROC)load("glBlendFunc");
	glad_glBufferData = (PFNGLBUFFERDATAPROC)load("glBufferData");
	glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)load("glBufferSubData");
	glad_glClear = (PFNGLCLEARPROC)load("glClear");
	glad_glClearColorx = (PFNGLCLEARCOLORXPROC)load("glClearColorx");
	glad_glClearDepthx = (PFNGLCLEARDEPTHXPROC)load("glClearDepthx");
	glad_glClearStencil = (PFNGLCLEARSTENCILPROC)load("glClearStencil");
	glad_glClientActiveTexture = (PFNGLCLIENTACTIVETEXTUREPROC)load("glClientActiveTexture");
	glad_glClipPlanex = (PFNGLCLIPPLANEXPROC)load("glClipPlanex");
	glad_glColor4ub = (PFNGLCOLOR4UBPROC)load("glColor4ub");
	glad_glColor4x = (PFNGLCOLOR4XPROC)load("glColor4x");
	glad_glColorMask = (PFNGLCOLORMASKPROC)load("glColorMask");
	glad_glColorPointer = (PFNGLCOLORPOINTERPROC)load("glColorPointer");
	glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)load("glCompressedTexImage2D");
	glad_glCompressedTexSubImage2D = (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)load("glCompressedTexSubImage2D");
	glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)load("glCopyTexImage2D");
	glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)load("glCopyTexSubImage2D");
	glad_glCullFace = (PFNGLCULLFACEPROC)load("glCullFace");
	glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)load("glDeleteBuffers");
	glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)load("glDeleteTextures");
	glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)load("glDepthFunc");
	glad_glDepthMask = (PFNGLDEPTHMASKPROC)load("glDepthMask");
	glad_glDepthRangex = (PFNGLDEPTHRANGEXPROC)load("glDepthRangex");
	glad_glDisable = (PFNGLDISABLEPROC)load("glDisable");
	glad_glDisableClientState = (PFNGLDISABLECLIENTSTATEPROC)load("glDisableClientState");
	glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)load("glDrawArrays");
	glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)load("glDrawElements");
	glad_glEnable = (PFNGLENABLEPROC)load("glEnable");
	glad_glEnableClientState = (PFNGLENABLECLIENTSTATEPROC)load("glEnableClientState");
	glad_glFinish = (PFNGLFINISHPROC)load("glFinish");
	glad_glFlush = (PFNGLFLUSHPROC)load("glFlush");
	glad_glFogx = (PFNGLFOGXPROC)load("glFogx");
	glad_glFogxv = (PFNGLFOGXVPROC)load("glFogxv");
	glad_glFrontFace = (PFNGLFRONTFACEPROC)load("glFrontFace");
	glad_glFrustumx = (PFNGLFRUSTUMXPROC)load("glFrustumx");
	glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)load("glGetBooleanv");
	glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)load("glGetBufferParameteriv");
	glad_glGetClipPlanex = (PFNGLGETCLIPPLANEXPROC)load("glGetClipPlanex");
	glad_glGenBuffers = (PFNGLGENBUFFERSPROC)load("glGenBuffers");
	glad_glGenTextures = (PFNGLGENTEXTURESPROC)load("glGenTextures");
	glad_glGetError = (PFNGLGETERRORPROC)load("glGetError");
	glad_glGetFixedv = (PFNGLGETFIXEDVPROC)load("glGetFixedv");
	glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)load("glGetIntegerv");
	glad_glGetLightxv = (PFNGLGETLIGHTXVPROC)load("glGetLightxv");
	glad_glGetMaterialxv = (PFNGLGETMATERIALXVPROC)load("glGetMaterialxv");
	glad_glGetPointerv = (PFNGLGETPOINTERVPROC)load("glGetPointerv");
	glad_glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	glad_glGetTexEnviv = (PFNGLGETTEXENVIVPROC)load("glGetTexEnviv");
	glad_glGetTexEnvxv = (PFNGLGETTEXENVXVPROC)load("glGetTexEnvxv");
	glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)load("glGetTexParameteriv");
	glad_glGetTexParameterxv = (PFNGLGETTEXPARAMETERXVPROC)load("glGetTexParameterxv");
	glad_glHint = (PFNGLHINTPROC)load("glHint");
	glad_glIsBuffer = (PFNGLISBUFFERPROC)load("glIsBuffer");
	glad_glIsEnabled = (PFNGLISENABLEDPROC)load("glIsEnabled");
	glad_glIsTexture = (PFNGLISTEXTUREPROC)load("glIsTexture");
	glad_glLightModelx = (PFNGLLIGHTMODELXPROC)load("glLightModelx");
	glad_glLightModelxv = (PFNGLLIGHTMODELXVPROC)load("glLightModelxv");
	glad_glLightx = (PFNGLLIGHTXPROC)load("glLightx");
	glad_glLightxv = (PFNGLLIGHTXVPROC)load("glLightxv");
	glad_glLineWidthx = (PFNGLLINEWIDTHXPROC)load("glLineWidthx");
	glad_glLoadIdentity = (PFNGLLOADIDENTITYPROC)load("glLoadIdentity");
	glad_glLoadMatrixx = (PFNGLLOADMATRIXXPROC)load("glLoadMatrixx");
	glad_glLogicOp = (PFNGLLOGICOPPROC)load("glLogicOp");
	glad_glMaterialx = (PFNGLMATERIALXPROC)load("glMaterialx");
	glad_glMaterialxv = (PFNGLMATERIALXVPROC)load("glMaterialxv");
	glad_glMatrixMode = (PFNGLMATRIXMODEPROC)load("glMatrixMode");
	glad_glMultMatrixx = (PFNGLMULTMATRIXXPROC)load("glMultMatrixx");
	glad_glMultiTexCoord4x = (PFNGLMULTITEXCOORD4XPROC)load("glMultiTexCoord4x");
	glad_glNormal3x = (PFNGLNORMAL3XPROC)load("glNormal3x");
	glad_glNormalPointer = (PFNGLNORMALPOINTERPROC)load("glNormalPointer");
	glad_glOrthox = (PFNGLORTHOXPROC)load("glOrthox");
	glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)load("glPixelStorei");
	glad_glPointParameterx = (PFNGLPOINTPARAMETERXPROC)load("glPointParameterx");
	glad_glPointParameterxv = (PFNGLPOINTPARAMETERXVPROC)load("glPointParameterxv");
	glad_glPointSizex = (PFNGLPOINTSIZEXPROC)load("glPointSizex");
	glad_glPolygonOffsetx = (PFNGLPOLYGONOFFSETXPROC)load("glPolygonOffsetx");
	glad_glPopMatrix = (PFNGLPOPMATRIXPROC)load("glPopMatrix");
	glad_glPushMatrix = (PFNGLPUSHMATRIXPROC)load("glPushMatrix");
	glad_glReadPixels = (PFNGLREADPIXELSPROC)load("glReadPixels");
	glad_glRotatex = (PFNGLROTATEXPROC)load("glRotatex");
	glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)load("glSampleCoverage");
	glad_glSampleCoveragex = (PFNGLSAMPLECOVERAGEXPROC)load("glSampleCoveragex");
	glad_glScalex = (PFNGLSCALEXPROC)load("glScalex");
	glad_glScissor = (PFNGLSCISSORPROC)load("glScissor");
	glad_glShadeModel = (PFNGLSHADEMODELPROC)load("glShadeModel");
	glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)load("glStencilFunc");
	glad_glStencilMask = (PFNGLSTENCILMASKPROC)load("glStencilMask");
	glad_glStencilOp = (PFNGLSTENCILOPPROC)load("glStencilOp");
	glad_glTexCoordPointer = (PFNGLTEXCOORDPOINTERPROC)load("glTexCoordPointer");
	glad_glTexEnvi = (PFNGLTEXENVIPROC)load("glTexEnvi");
	glad_glTexEnvx = (PFNGLTEXENVXPROC)load("glTexEnvx");
	glad_glTexEnviv = (PFNGLTEXENVIVPROC)load("glTexEnviv");
	glad_glTexEnvxv = (PFNGLTEXENVXVPROC)load("glTexEnvxv");
	glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)load("glTexImage2D");
	glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)load("glTexParameteri");
	glad_glTexParameterx = (PFNGLTEXPARAMETERXPROC)load("glTexParameterx");
	glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)load("glTexParameteriv");
	glad_glTexParameterxv = (PFNGLTEXPARAMETERXVPROC)load("glTexParameterxv");
	glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)load("glTexSubImage2D");
	glad_glTranslatex = (PFNGLTRANSLATEXPROC)load("glTranslatex");
	glad_glVertexPointer = (PFNGLVERTEXPOINTERPROC)load("glVertexPointer");
	glad_glViewport = (PFNGLVIEWPORTPROC)load("glViewport");
}